

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O3

bool __thiscall
UnifiedRegex::SyncToLiteralAndContinueInstT<UnifiedRegex::EquivScannerMixinT<4U>_>::Exec
          (SyncToLiteralAndContinueInstT<UnifiedRegex::EquivScannerMixinT<4U>_> *this,
          Matcher *matcher,Char *input,CharCount inputLength,CharCount *matchStart,
          CharCount *inputOffset,CharCount *nextSyncInputOffset,uint8 **instPointer,
          ContStack *contStack,AssertionStack *assertionStack,uint *qcTicks,bool firstIteration)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Program *pPVar4;
  uint uVar5;
  Type patLen;
  
  uVar5 = (this->super_EquivScannerMixinT<4U>).super_ScannerMixin.super_LiteralMixin.offset;
  patLen = (this->super_EquivScannerMixinT<4U>).super_ScannerMixin.super_LiteralMixin.length;
  pPVar4 = (matcher->program).ptr;
  if ((pPVar4->rep).insts.litbufLen - uVar5 < patLen * 4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                       ,0x2ae,
                       "(length * CaseInsensitive::EquivClassSize <= matcher.program->rep.insts.litbufLen - offset)"
                       ,
                       "length * CaseInsensitive::EquivClassSize <= matcher.program->rep.insts.litbufLen - offset"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
    pPVar4 = (matcher->program).ptr;
    uVar5 = (this->super_EquivScannerMixinT<4U>).super_ScannerMixin.super_LiteralMixin.offset;
    patLen = (this->super_EquivScannerMixinT<4U>).super_ScannerMixin.super_LiteralMixin.length;
  }
  bVar2 = TextbookBoyerMoore<char16_t>::Match<4u,4u>
                    (&(this->super_EquivScannerMixinT<4U>).super_ScannerMixin.scanner,input,
                     inputLength,inputOffset,(pPVar4->rep).insts.litbuf.ptr + uVar5,patLen,
                     matcher->stats);
  if (bVar2) {
    inputLength = *inputOffset;
    *instPointer = *instPointer + 0x449;
  }
  *matchStart = inputLength;
  return !bVar2;
}

Assistant:

inline bool SyncToLiteralAndContinueInstT<ScannerT>::Exec(REGEX_INST_EXEC_PARAMETERS) const
    {
        if (!this->Match(matcher, input, inputLength, inputOffset))
        {
            return matcher.HardFail(HARDFAIL_PARAMETERS(HardFailMode::ImmediateFail));
        }

        matchStart = inputOffset;
        instPointer += sizeof(*this);
        return false;
    }